

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3Fts3GetVarint(char *p,sqlite_int64 *v)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  byte *pbVar5;
  byte *pbVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  
  cVar1 = *p;
  if (cVar1 < '\0') {
    uVar7 = (int)cVar1 & 0x7f;
    uVar4 = (int)p[1] << 7;
    if (p[1] < '\0') {
      uVar7 = uVar4 & 0x3fff | uVar7;
      uVar4 = (int)p[2] << 0xe;
      if (p[2] < '\0') {
        uVar7 = uVar4 & 0x1fffff | uVar7;
        uVar4 = (int)p[3] << 0x15;
        if (p[3] < '\0') {
          uVar9 = (ulong)(uVar4 & 0xfffffff | uVar7);
          uVar8 = 0x1c;
          pbVar5 = (byte *)(p + 4);
          do {
            pbVar6 = (byte *)(p + 10);
            if (0x3f < uVar8) break;
            bVar2 = *pbVar5;
            pbVar6 = pbVar5 + 1;
            uVar9 = uVar9 + ((ulong)(bVar2 & 0x7f) << ((byte)uVar8 & 0x3f));
            uVar8 = uVar8 + 7;
            pbVar5 = pbVar6;
          } while ((char)bVar2 < '\0');
          *v = uVar9;
          return (int)pbVar6 - (int)p;
        }
        *v = (ulong)(uVar4 | uVar7);
        iVar3 = 4;
      }
      else {
        *v = (ulong)(uVar4 | uVar7);
        iVar3 = 3;
      }
    }
    else {
      *v = (ulong)(uVar4 | uVar7);
      iVar3 = 2;
    }
  }
  else {
    *v = (ulong)(uint)(int)cVar1;
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3GetVarint(const char *p, sqlite_int64 *v){
  const char *pStart = p;
  u32 a;
  u64 b;
  int shift;

  GETVARINT_INIT(a, p, 0,  0x00,     0x80, *v, 1);
  GETVARINT_STEP(a, p, 7,  0x7F,     0x4000, *v, 2);
  GETVARINT_STEP(a, p, 14, 0x3FFF,   0x200000, *v, 3);
  GETVARINT_STEP(a, p, 21, 0x1FFFFF, 0x10000000, *v, 4);
  b = (a & 0x0FFFFFFF );

  for(shift=28; shift<=63; shift+=7){
    u64 c = *p++;
    b += (c&0x7F) << shift;
    if( (c & 0x80)==0 ) break;
  }
  *v = b;
  return (int)(p - pStart);
}